

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall
MultiBodyInplaceSolverIslandCallback::processIsland
          (MultiBodyInplaceSolverIslandCallback *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifolds,int numManifolds,int islandId)

{
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  MultiBodyInplaceSolverIslandCallback *in_stack_00000020;
  int i;
  int numCurMultiBodyConstraints;
  int numCurConstraints;
  btMultiBodyConstraint **startMultiBodyConstraint;
  btTypedConstraint **startConstraint;
  btMultiBodyConstraint *in_stack_ffffffffffffff60;
  btPersistentManifold **in_stack_ffffffffffffff68;
  btTypedConstraint *in_stack_ffffffffffffff70;
  int local_64;
  int local_60;
  int local_5c;
  long local_50;
  
  if (in_R9D < 0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x68))
              (*(long **)(in_RDI + 0x10),in_RSI,in_EDX,in_RCX,in_R8D,*(undefined8 *)(in_RDI + 0x28),
               *(undefined4 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x18),
               *(undefined4 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 8),
               *(undefined8 *)(in_RDI + 0x38),*(undefined8 *)(in_RDI + 0x40));
  }
  else {
    local_50 = 0;
    local_5c = 0;
    local_60 = 0;
    for (local_64 = 0; local_64 < *(int *)(in_RDI + 0x30); local_64 = local_64 + 1) {
      iVar1 = btGetConstraintIslandId2(in_stack_ffffffffffffff70);
      if (iVar1 == in_R9D) {
        local_50 = *(long *)(in_RDI + 0x28) + (long)local_64 * 8;
        break;
      }
    }
    for (; local_64 < *(int *)(in_RDI + 0x30); local_64 = local_64 + 1) {
      iVar1 = btGetConstraintIslandId2(in_stack_ffffffffffffff70);
      if (iVar1 == in_R9D) {
        local_5c = local_5c + 1;
      }
    }
    local_64 = 0;
    while ((local_64 < *(int *)(in_RDI + 0x20) &&
           (iVar1 = btGetMultiBodyConstraintIslandId(in_stack_ffffffffffffff60), iVar1 != in_R9D)))
    {
      local_64 = local_64 + 1;
    }
    for (; local_64 < *(int *)(in_RDI + 0x20); local_64 = local_64 + 1) {
      iVar1 = btGetMultiBodyConstraintIslandId(in_stack_ffffffffffffff60);
      if (iVar1 == in_R9D) {
        local_60 = local_60 + 1;
      }
    }
    if (*(int *)(*(long *)(in_RDI + 8) + 0x48) < 2) {
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))
                (*(long **)(in_RDI + 0x10),in_RSI,in_EDX,in_RCX,in_R8D,local_50,local_5c,
                 *(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x38),
                 *(undefined8 *)(in_RDI + 0x40));
    }
    else {
      for (local_64 = 0; local_64 < in_EDX; local_64 = local_64 + 1) {
        btAlignedObjectArray<btCollisionObject_*>::push_back
                  ((btAlignedObjectArray<btCollisionObject_*> *)in_stack_ffffffffffffff70,
                   (btCollisionObject **)in_stack_ffffffffffffff68);
      }
      for (local_64 = 0; local_64 < in_R8D; local_64 = local_64 + 1) {
        btAlignedObjectArray<btPersistentManifold_*>::push_back
                  ((btAlignedObjectArray<btPersistentManifold_*> *)in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68);
      }
      for (local_64 = 0; local_64 < local_5c; local_64 = local_64 + 1) {
        btAlignedObjectArray<btTypedConstraint_*>::push_back
                  ((btAlignedObjectArray<btTypedConstraint_*> *)in_stack_ffffffffffffff70,
                   (btTypedConstraint **)in_stack_ffffffffffffff68);
      }
      for (local_64 = 0; local_64 < local_60; local_64 = local_64 + 1) {
        btAlignedObjectArray<btMultiBodyConstraint_*>::push_back
                  ((btAlignedObjectArray<btMultiBodyConstraint_*> *)in_stack_ffffffffffffff70,
                   (btMultiBodyConstraint **)in_stack_ffffffffffffff68);
      }
      iVar1 = btAlignedObjectArray<btTypedConstraint_*>::size
                        ((btAlignedObjectArray<btTypedConstraint_*> *)(in_RDI + 0x88));
      iVar2 = btAlignedObjectArray<btPersistentManifold_*>::size
                        ((btAlignedObjectArray<btPersistentManifold_*> *)(in_RDI + 0x68));
      if (*(int *)(*(long *)(in_RDI + 8) + 0x48) < iVar1 + iVar2) {
        processConstraints(in_stack_00000020);
      }
    }
  }
  return;
}

Assistant:

virtual	void	processIsland(btCollisionObject** bodies,int numBodies,btPersistentManifold**	manifolds,int numManifolds, int islandId)
	{
		if (islandId<0)
		{
			///we don't split islands, so all constraints/contact manifolds/bodies are passed into the solver regardless the island id
			m_solver->solveMultiBodyGroup( bodies,numBodies,manifolds, numManifolds,m_sortedConstraints, m_numConstraints, &m_multiBodySortedConstraints[0],m_numConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
		} else
		{
				//also add all non-contact constraints/joints for this island
			btTypedConstraint** startConstraint = 0;
			btMultiBodyConstraint** startMultiBodyConstraint = 0;

			int numCurConstraints = 0;
			int numCurMultiBodyConstraints = 0;

			int i;
			
			//find the first constraint for this island

			for (i=0;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId2(m_sortedConstraints[i]) == islandId)
				{
					startConstraint = &m_sortedConstraints[i];
					break;
				}
			}
			//count the number of constraints in this island
			for (;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId2(m_sortedConstraints[i]) == islandId)
				{
					numCurConstraints++;
				}
			}

			for (i=0;i<m_numMultiBodyConstraints;i++)
			{
				if (btGetMultiBodyConstraintIslandId(m_multiBodySortedConstraints[i]) == islandId)
				{
					
					startMultiBodyConstraint = &m_multiBodySortedConstraints[i];
					break;
				}
			}
			//count the number of multi body constraints in this island
			for (;i<m_numMultiBodyConstraints;i++)
			{
				if (btGetMultiBodyConstraintIslandId(m_multiBodySortedConstraints[i]) == islandId)
				{
					numCurMultiBodyConstraints++;
				}
			}

			if (m_solverInfo->m_minimumSolverBatchSize<=1)
			{
				m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,startConstraint,numCurConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
			} else
			{
				
				for (i=0;i<numBodies;i++)
					m_bodies.push_back(bodies[i]);
				for (i=0;i<numManifolds;i++)
					m_manifolds.push_back(manifolds[i]);
				for (i=0;i<numCurConstraints;i++)
					m_constraints.push_back(startConstraint[i]);
				
				for (i=0;i<numCurMultiBodyConstraints;i++)
					m_multiBodyConstraints.push_back(startMultiBodyConstraint[i]);
				
				if ((m_constraints.size()+m_manifolds.size())>m_solverInfo->m_minimumSolverBatchSize)
				{
					processConstraints();
				} else
				{
					//printf("deferred\n");
				}
			}
		}
	}